

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCreator_BnB.h
# Opt level: O0

void __thiscall
BGIP_SolverCreator_BnB<JointPolicyPureVector>::BGIP_SolverCreator_BnB
          (BGIP_SolverCreator_BnB<JointPolicyPureVector> *this,int verbose,size_t nrSolutions,
          bool keepAll,BnB_JointTypeOrdering ordering,bool reComputeHeur,double deadlineInSeconds)

{
  byte in_CL;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  BGIP_IncrementalSolverCreatorInterface_T<JointPolicyPureVector> *in_XMM0_Qa;
  
  BGIP_IncrementalSolverCreatorInterface_T<JointPolicyPureVector>::
  BGIP_IncrementalSolverCreatorInterface_T(in_XMM0_Qa);
  *in_RDI = &PTR__BGIP_SolverCreator_BnB_00179be8;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  in_RDI[2] = in_RDX;
  *(byte *)(in_RDI + 3) = in_CL & 1;
  *(undefined4 *)((long)in_RDI + 0x1c) = in_R8D;
  *(byte *)(in_RDI + 4) = in_R9B & 1;
  in_RDI[5] = in_XMM0_Qa;
  return;
}

Assistant:

BGIP_SolverCreator_BnB(int verbose=0,
                           size_t nrSolutions=1,
                           bool keepAll=false,
                           BGIP_BnB::BnB_JointTypeOrdering ordering=BGIP_BnB::IdentityMapping,
                           bool reComputeHeur=false,
                           double deadlineInSeconds=0)
        :
        _m_verbose(verbose),
        _m_nrSolutions(nrSolutions),
        _m_keepAll(keepAll),
        _m_jtOrdering(ordering),
        _m_reComputeH(reComputeHeur),
        _m_deadlineInSeconds(deadlineInSeconds)
        {}